

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLhandler.c
# Opt level: O3

void RDL_giveVertices(uint a,uint b,char *array,RDL_sPathInfo *spi,char *visited)

{
  uint b_00;
  RDL_graph **ppRVar1;
  RDL_graph *pRVar2;
  ulong uVar3;
  
  visited[b] = '\x01';
  array[b] = '\x01';
  if (a != b) {
    ppRVar1 = spi->dPaths;
    pRVar2 = ppRVar1[a];
    if (pRVar2->degree[b] != 0) {
      uVar3 = 0;
      do {
        b_00 = pRVar2->adjList[b][uVar3][0];
        if (visited[b_00] == '\0') {
          RDL_giveVertices(a,b_00,array,spi,visited);
          ppRVar1 = spi->dPaths;
        }
        uVar3 = uVar3 + 1;
        pRVar2 = ppRVar1[a];
      } while (uVar3 < pRVar2->degree[b]);
    }
  }
  return;
}

Assistant:

void RDL_giveVertices(unsigned a, unsigned b, char *array,
    const RDL_sPathInfo *spi, char *visited)
{
 /* similar to the function "List_Paths" from Vismara*/
  unsigned i, vertex;

  visited[b] = 1;

  if(a==b)
  {
    array[a] = 1;
    return;
  }
  array[b] = 1;
  /*for each vertex adjacent to b in U_a*/
  for(i=0; i<spi->dPaths[a]->degree[b]; ++i)
  {
    vertex = spi->dPaths[a]->adjList[b][i][0];
    if (!visited[vertex]) {
      RDL_giveVertices(a, vertex, array, spi, visited);
    }
  }
}